

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meld.cpp
# Opt level: O2

bool __thiscall mahjong::Meld::isSame(Meld *this,Meld *meld)

{
  bool bVar1;
  IsSame local_12;
  IsSame local_11;
  
  bVar1 = IsSame::operator()(&local_11,
                             (this->tiles).
                             super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                             (meld->tiles).
                             super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                             _M_impl.super__Vector_impl_data._M_start);
  if (bVar1) {
    bVar1 = IsSame::operator()(&local_12,
                               (this->tiles).
                               super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -1,
                               (meld->tiles).
                               super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -1);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Meld::isSame(const Meld& meld) const
{
	return IsSame()(tiles.front(), meld.tiles.front()) &&
		IsSame()(tiles.back(), meld.tiles.back());
}